

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

void AString_remove(AString *str,size_t index,size_t count)

{
  size_t count_local;
  size_t index_local;
  AString *str_local;
  
  if ((str != (AString *)0x0) && (index < str->size)) {
    if ((count < 0xffffffffffffffff - index) && (index + count < str->size)) {
      str->size = str->size - count;
      memmove(str->buffer + index,str->buffer + count + index,(str->size - index) + 1);
    }
    else {
      str->size = index;
      str->buffer[str->size] = '\0';
    }
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_remove(struct AString *str, size_t index, size_t count)
{
    if(str != nullptr && index < str->size) {
        if(count >= ((size_t) 0) - index - 1 || index + count >= str->size) {
            str->size = index;
            str->buffer[str->size] = '\0';
        } else {
            str->size -= count;
            memmove(str->buffer + index, str->buffer + index + count, (str->size - index + 1) * sizeof(char)); /* +1 for '\0' */
        }
    }
}